

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

void __thiscall tcmalloc::PageHeap::IncrementalScavenge(PageHeap *this,Length n)

{
  int64_t *piVar1;
  uint64_t *puVar2;
  Length LVar3;
  int64_t iVar4;
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  
  piVar1 = &this->scavenge_counter_;
  *piVar1 = *piVar1 - n;
  dVar5 = FLAG__namespace_do_not_use_directly_use_DECLARE_double_instead::
          FLAGS_tcmalloc_release_rate;
  if (-1 < *piVar1) {
    return;
  }
  iVar4 = 0x40000;
  if (1e-06 < FLAG__namespace_do_not_use_directly_use_DECLARE_double_instead::
              FLAGS_tcmalloc_release_rate) {
    puVar2 = &(this->stats_).scavenge_count;
    *puVar2 = *puVar2 + 1;
    LVar3 = ReleaseAtLeastNPages(this,1);
    if (LVar3 != 0) {
      auVar6._8_4_ = (int)(LVar3 >> 0x20);
      auVar6._0_8_ = LVar3;
      auVar6._12_4_ = 0x45300000;
      dVar7 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)LVar3) - 4503599627370496.0)) * (1000.0 / dVar5);
      dVar5 = 1048576.0;
      if (dVar7 <= 1048576.0) {
        dVar5 = dVar7;
      }
      iVar4 = (int64_t)dVar5;
    }
  }
  this->scavenge_counter_ = iVar4;
  return;
}

Assistant:

void PageHeap::IncrementalScavenge(Length n) {
  ASSERT(lock_.IsHeld());
  // Fast path; not yet time to release memory
  scavenge_counter_ -= n;
  if (scavenge_counter_ >= 0) return;  // Not yet time to scavenge

  const double rate = FLAGS_tcmalloc_release_rate;
  if (rate <= 1e-6) {
    // Tiny release rate means that releasing is disabled.
    scavenge_counter_ = kDefaultReleaseDelay;
    return;
  }

  ++stats_.scavenge_count;

  Length released_pages = ReleaseAtLeastNPages(1);

  if (released_pages == 0) {
    // Nothing to scavenge, delay for a while.
    scavenge_counter_ = kDefaultReleaseDelay;
  } else {
    // Compute how long to wait until we return memory.
    // FLAGS_tcmalloc_release_rate==1 means wait for 1000 pages
    // after releasing one page.
    const double mult = 1000.0 / rate;
    double wait = mult * static_cast<double>(released_pages);
    if (wait > kMaxReleaseDelay) {
      // Avoid overflow and bound to reasonable range.
      wait = kMaxReleaseDelay;
    }
    scavenge_counter_ = static_cast<int64_t>(wait);
  }
}